

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<6,_9,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 in_RAX;
  undefined8 *puVar1;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  float *pfVar5;
  long lVar6;
  undefined8 *puVar7;
  float *pfVar8;
  int col;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar13;
  undefined4 uVar14;
  float afStack_88 [4];
  Vector<float,_3> res_2;
  Vector<float,_3> res_1;
  undefined8 uStack_58;
  Mat3 m;
  float local_28 [8];
  undefined8 local_8;
  long lVar12;
  
  local_8 = in_RAX;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    puVar1 = &uStack_58;
    lVar3 = 0;
    lVar6 = 0;
    do {
      lVar9 = 0;
      auVar10 = _DAT_019f34d0;
      do {
        bVar13 = SUB164(auVar10 ^ _DAT_019ec5b0,4) == -0x80000000 &&
                 SUB164(auVar10 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
        if (bVar13) {
          uVar14 = 0x3f800000;
          if (lVar3 != lVar9) {
            uVar14 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar9) = uVar14;
        }
        if (bVar13) {
          uVar14 = 0x3f800000;
          if (lVar3 + -0xc != lVar9) {
            uVar14 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar9 + 0xc) = uVar14;
        }
        lVar12 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar12 + 2;
        lVar9 = lVar9 + 0x18;
      } while (lVar9 != 0x30);
      lVar6 = lVar6 + 1;
      lVar3 = lVar3 + 0xc;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
    } while (lVar6 != 3);
    uStack_58 = *(undefined8 *)evalCtx->in[0].m_data;
    m.m_data.m_data[0].m_data[1] = evalCtx->in[1].m_data[0];
    m.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[2];
    m.m_data.m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    m.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    m.m_data.m_data[2].m_data[0] = evalCtx->in[2].m_data[2];
  }
  else {
    puVar1 = &uStack_58;
    m.m_data.m_data[0].m_data[2] = 0.0;
    m.m_data.m_data[1].m_data[0] = 0.0;
    m.m_data.m_data[1].m_data[1] = 0.0;
    m.m_data.m_data[1].m_data[2] = 0.0;
    uStack_58 = 0;
    m.m_data.m_data[0].m_data[0] = 0.0;
    m.m_data.m_data[0].m_data[1] = 0.0;
    m.m_data.m_data[2].m_data[0] = 0.0;
    puVar4 = &s_constInMat3x3;
    lVar3 = 0;
    do {
      lVar6 = 0;
      puVar7 = puVar1;
      do {
        *(undefined4 *)puVar7 = puVar4[lVar6];
        lVar6 = lVar6 + 1;
        puVar7 = (undefined8 *)((long)puVar7 + 0xc);
      } while (lVar6 != 3);
      lVar3 = lVar3 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar4 = puVar4 + 3;
    } while (lVar3 != 3);
  }
  pfVar2 = local_28;
  local_28[4] = 0.0;
  local_28[5] = 0.0;
  local_28[6] = 0.0;
  local_28[7] = 0.0;
  local_28[0] = 0.0;
  local_28[1] = 0.0;
  local_28[2] = 0.0;
  local_28[3] = 0.0;
  local_8 = (ulong)local_8._4_4_ << 0x20;
  lVar3 = 0;
  lVar6 = 0;
  do {
    lVar9 = 0;
    auVar11 = _DAT_019f34d0;
    do {
      bVar13 = SUB164(auVar11 ^ _DAT_019ec5b0,4) == -0x80000000 &&
               SUB164(auVar11 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
      if (bVar13) {
        uVar14 = 0x3f800000;
        if (lVar3 != lVar9) {
          uVar14 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar9) = uVar14;
      }
      if (bVar13) {
        uVar14 = 0x3f800000;
        if (lVar3 + -0xc != lVar9) {
          uVar14 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar9 + 0xc) = uVar14;
      }
      lVar12 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar12 + 2;
      lVar9 = lVar9 + 0x18;
    } while (lVar9 != 0x30);
    lVar6 = lVar6 + 1;
    lVar3 = lVar3 + 0xc;
    pfVar2 = pfVar2 + 1;
  } while (lVar6 != 3);
  pfVar2 = local_28;
  pfVar5 = (float *)&uStack_58;
  lVar3 = 0;
  do {
    lVar6 = 0;
    pfVar8 = pfVar5;
    do {
      pfVar2[lVar6] = *pfVar8;
      lVar6 = lVar6 + 1;
      pfVar8 = pfVar8 + 3;
    } while (lVar6 != 3);
    lVar3 = lVar3 + 1;
    pfVar2 = pfVar2 + 3;
    pfVar5 = pfVar5 + 1;
  } while (lVar3 != 3);
  stack0xffffffffffffff90 = 0;
  lVar3 = 0;
  do {
    res_2.m_data[lVar3 + 2] = local_28[lVar3] + local_28[lVar3 + 3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  res_2.m_data[0] = 0.0;
  afStack_88[2] = 0.0;
  afStack_88[3] = 0.0;
  lVar3 = 0;
  do {
    res_2.m_data[lVar3 + -2] = res_2.m_data[lVar3 + 2] + local_28[lVar3 + 6];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)res_2.m_data[lVar3 + 2]] = afStack_88[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(transpose(in0));
	}